

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

int Llb_CoreExperiment(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars,Vec_Ptr_t *vResult,
                      abctime TimeTarget)

{
  int iVar1;
  Llb_Img_t *p;
  Vec_Ptr_t *pVVar2;
  
  p = Llb_CoreStart(pInit,pAig,pPars);
  pVVar2 = Llb_CoreConstructAll(pAig,vResult,p->vVarsNs,TimeTarget);
  p->vDdMans = pVVar2;
  if (pVVar2 == (Vec_Ptr_t *)0x0) {
    iVar1 = -1;
    if (pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) while deriving the partitions.\n",
             (ulong)(uint)pPars->TimeLimit);
    }
  }
  else {
    iVar1 = Llb_CoreReachability(p);
  }
  Llb_CoreStop(p);
  return iVar1;
}

Assistant:

int Llb_CoreExperiment( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t * pPars, Vec_Ptr_t * vResult, abctime TimeTarget )
{
    int RetValue;
    Llb_Img_t * p;
//    printf( "\n" );
//    pPars->fVerbose = 1;
    p = Llb_CoreStart( pInit, pAig, pPars );
    p->vDdMans = Llb_CoreConstructAll( pAig, vResult, p->vVarsNs, TimeTarget );
    if ( p->vDdMans == NULL )
    {
        if ( !pPars->fSilent )
            printf( "Reached timeout (%d seconds) while deriving the partitions.\n", pPars->TimeLimit );
        Llb_CoreStop( p );
        return -1;
    }
    RetValue = Llb_CoreReachability( p );
    Llb_CoreStop( p );
    return RetValue;
}